

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEIDeriv1_Writer.cpp
# Opt level: O0

void __thiscall
OSTEIDeriv1_Writer::Write_Permute_(OSTEIDeriv1_Writer *this,QAM *am,bool swap12,bool swap34)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  ostream *poVar5;
  QAM *am_00;
  byte in_CL;
  byte in_DL;
  long in_RDI;
  string idx;
  char vd;
  char vc;
  char vb;
  char va;
  size_t ncart_cd;
  size_t ncart_bcd;
  size_t ncart_d2;
  size_t ncart_c2;
  size_t ncart_b2;
  size_t ncart_a2;
  size_t ncart_d;
  size_t ncart_c;
  size_t ncart_b;
  size_t ncart_abcd;
  string fname;
  char *Q_var;
  char *P_var;
  QAM permuted;
  QAM *in_stack_fffffffffffff6d8;
  int i;
  QAM *pQVar6;
  QAM *in_stack_fffffffffffff6e0;
  char *this_00;
  QAM *in_stack_fffffffffffff700;
  QAM *in_stack_fffffffffffff740;
  OSTEIDeriv1_Writer *in_stack_fffffffffffff748;
  char (*in_stack_fffffffffffff7a8) [2];
  char *in_stack_fffffffffffff7b0;
  char (*in_stack_fffffffffffff7b8) [2];
  allocator *in_stack_fffffffffffff7c0;
  QAM *in_stack_fffffffffffff7c8;
  unsigned_long *in_stack_fffffffffffff810;
  char (*in_stack_fffffffffffff818) [2];
  char *in_stack_fffffffffffff820;
  allocator *paVar7;
  char (*in_stack_fffffffffffff828) [2];
  unsigned_long *in_stack_fffffffffffff830;
  char (*in_stack_fffffffffffff838) [2];
  char *in_stack_fffffffffffff840;
  char (*in_stack_fffffffffffff848) [2];
  unsigned_long *in_stack_fffffffffffff850;
  char (*in_stack_fffffffffffff858) [2];
  char *in_stack_fffffffffffff860;
  char (*in_stack_fffffffffffff868) [2];
  QAM *in_stack_fffffffffffff9b0;
  undefined4 in_stack_fffffffffffff9b8;
  undefined4 in_stack_fffffffffffff9bc;
  string local_410 [39];
  allocator local_3e9;
  string local_3e8 [32];
  string local_3c8 [39];
  allocator local_3a1;
  string local_3a0 [32];
  string local_380 [39];
  allocator local_359;
  string local_358 [32];
  string local_338 [39];
  allocator local_311;
  string local_310 [32];
  string local_2f0 [39];
  allocator local_2c9;
  string local_2c8 [32];
  string local_2a8 [39];
  allocator local_281;
  string local_280 [32];
  string local_260 [39];
  allocator local_239;
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [36];
  char local_1d4 [4];
  long local_1d0;
  QAM local_1c8;
  long local_198;
  long local_190;
  ulong local_158;
  allocator local_149;
  string local_148 [32];
  string local_128 [80];
  string local_d8 [32];
  char *local_b8;
  char *local_b0;
  string local_78 [32];
  undefined4 local_58;
  byte local_12;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_12 = in_CL & 1;
  QAM::QAM(in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8);
  if ((local_11 & 1) != 0) {
    piVar3 = QAM::operator[](in_stack_fffffffffffff6e0,
                             (int)((ulong)in_stack_fffffffffffff6d8 >> 0x20));
    piVar4 = QAM::operator[](in_stack_fffffffffffff6e0,
                             (int)((ulong)in_stack_fffffffffffff6d8 >> 0x20));
    std::swap<int>(piVar3,piVar4);
  }
  if ((local_12 & 1) != 0) {
    piVar3 = QAM::operator[](in_stack_fffffffffffff6e0,
                             (int)((ulong)in_stack_fffffffffffff6d8 >> 0x20));
    piVar4 = QAM::operator[](in_stack_fffffffffffff6e0,
                             (int)((ulong)in_stack_fffffffffffff6d8 >> 0x20));
    std::swap<int>(piVar3,piVar4);
  }
  if (((local_12 & 1) != 0) && ((local_11 & 1) == 0)) {
    piVar3 = QAM::operator[](in_stack_fffffffffffff6e0,
                             (int)((ulong)in_stack_fffffffffffff6d8 >> 0x20));
    iVar1 = *piVar3;
    piVar3 = QAM::operator[](in_stack_fffffffffffff6e0,
                             (int)((ulong)in_stack_fffffffffffff6d8 >> 0x20));
    if (iVar1 == *piVar3) {
      local_58 = 1;
      goto LAB_001645a8;
    }
  }
  if (((local_11 & 1) != 0) && ((local_12 & 1) == 0)) {
    piVar3 = QAM::operator[](in_stack_fffffffffffff6e0,
                             (int)((ulong)in_stack_fffffffffffff6d8 >> 0x20));
    iVar1 = *piVar3;
    piVar3 = QAM::operator[](in_stack_fffffffffffff6e0,
                             (int)((ulong)in_stack_fffffffffffff6d8 >> 0x20));
    if (iVar1 == *piVar3) {
      local_58 = 1;
      goto LAB_001645a8;
    }
  }
  if (((local_11 & 1) == 0) || ((local_12 & 1) == 0)) {
LAB_00162757:
    poVar5 = *(ostream **)(in_RDI + 8);
    QAM::QAM(in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8);
    FunctionPrototype__abi_cxx11_
              ((OSTEIDeriv1_Writer *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8),
               in_stack_fffffffffffff9b0);
    poVar5 = std::operator<<(poVar5,local_78);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string(local_78);
    QAM::~QAM((QAM *)0x1627f0);
    std::operator<<(*(ostream **)(in_RDI + 8),"{\n");
    local_b0 = "P";
    local_b8 = "Q";
    if ((local_11 & 1) != 0) {
      local_b0 = "P_tmp";
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"double P_AB[3*P.nshell12];\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"struct simint_multi_shellpair P_tmp = P;\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"P_tmp.alpha2 = P.beta2;  P_tmp.beta2 = P.alpha2;\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"P_tmp.PA_x = P.PB_x;  P_tmp.PA_y = P.PB_y;  P_tmp.PA_z = P.PB_z;\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"P_tmp.PB_x = P.PA_x;  P_tmp.PB_y = P.PA_y;  P_tmp.PB_z = P.PA_z;\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"P_tmp.AB_x = P_AB;\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"P_tmp.AB_y = P_AB + P.nshell12;\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"P_tmp.AB_z = P_AB + 2*P.nshell12;\n");
      std::operator<<(*(ostream **)(in_RDI + 8),"\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"for(int i = 0; i < P.nshell12; i++)\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"{\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent2_abi_cxx11_);
      std::operator<<(poVar5,"P_tmp.AB_x[i] = -P.AB_x[i];\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent2_abi_cxx11_);
      std::operator<<(poVar5,"P_tmp.AB_y[i] = -P.AB_y[i];\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent2_abi_cxx11_);
      std::operator<<(poVar5,"P_tmp.AB_z[i] = -P.AB_z[i];\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"}\n\n");
    }
    if ((local_12 & 1) != 0) {
      local_b8 = "Q_tmp";
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"double Q_AB[3*Q.nshell12];\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"struct simint_multi_shellpair Q_tmp = Q;\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"Q_tmp.alpha2 = Q.beta2;  Q_tmp.beta2 = Q.alpha2;\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"Q_tmp.PA_x = Q.PB_x;  Q_tmp.PA_y = Q.PB_y;  Q_tmp.PA_z = Q.PB_z;\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"Q_tmp.PB_x = Q.PA_x;  Q_tmp.PB_y = Q.PA_y;  Q_tmp.PB_z = Q.PA_z;\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"Q_tmp.AB_x = Q_AB;\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"Q_tmp.AB_y = Q_AB + Q.nshell12;\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"Q_tmp.AB_z = Q_AB + 2*Q.nshell12;\n");
      std::operator<<(*(ostream **)(in_RDI + 8),"\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"for(int i = 0; i < Q.nshell12; i++)\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"{\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent2_abi_cxx11_);
      std::operator<<(poVar5,"Q_tmp.AB_x[i] = -Q.AB_x[i];\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent2_abi_cxx11_);
      std::operator<<(poVar5,"Q_tmp.AB_y[i] = -Q.AB_y[i];\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent2_abi_cxx11_);
      std::operator<<(poVar5,"Q_tmp.AB_z[i] = -Q.AB_z[i];\n");
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      std::operator<<(poVar5,"}\n\n");
    }
    QAM::QAM(in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8);
    FunctionName__abi_cxx11_(in_stack_fffffffffffff748,in_stack_fffffffffffff740);
    QAM::~QAM((QAM *)0x162f46);
    poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
    poVar5 = std::operator<<(poVar5,"int ret = ");
    poVar5 = std::operator<<(poVar5,local_d8);
    poVar5 = std::operator<<(poVar5,"(");
    poVar5 = std::operator<<(poVar5,local_b0);
    poVar5 = std::operator<<(poVar5,", ");
    poVar5 = std::operator<<(poVar5,local_b8);
    poVar5 = std::operator<<(poVar5,", screen_tol, ");
    poVar5 = std::operator<<(poVar5,"work, ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_148,"",&local_149);
    ArrVarName(in_stack_fffffffffffff7c8,(string *)in_stack_fffffffffffff7c0);
    poVar5 = std::operator<<(poVar5,local_128);
    std::operator<<(poVar5,");\n");
    std::__cxx11::string::~string(local_128);
    std::__cxx11::string::~string(local_148);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
    QAM::QAM(in_stack_fffffffffffff6e0,in_stack_fffffffffffff6d8);
    i = (int)((ulong)in_stack_fffffffffffff6d8 >> 0x20);
    iVar1 = NCART(in_stack_fffffffffffff700);
    QAM::~QAM((QAM *)0x163154);
    local_158 = (long)iVar1;
    piVar3 = QAM::operator[](in_stack_fffffffffffff6e0,i);
    iVar1 = NCART(*piVar3);
    local_190 = (long)iVar1;
    piVar3 = QAM::operator[](in_stack_fffffffffffff6e0,i);
    iVar1 = NCART(*piVar3);
    local_198 = (long)iVar1;
    am_00 = (QAM *)QAM::operator[](in_stack_fffffffffffff6e0,i);
    iVar2 = NCART((am_00->qam)._M_elems[0]);
    local_1c8._40_8_ = SEXT48(iVar2);
    piVar3 = QAM::operator[](in_stack_fffffffffffff6e0,i);
    iVar2 = NCART(*piVar3);
    local_1c8._32_8_ = SEXT48(iVar2);
    piVar3 = QAM::operator[](in_stack_fffffffffffff6e0,i);
    iVar2 = NCART(*piVar3);
    local_1c8._24_8_ = SEXT48(iVar2);
    piVar3 = QAM::operator[](in_stack_fffffffffffff6e0,i);
    iVar2 = NCART(*piVar3);
    local_1c8._16_8_ = SEXT48(iVar2);
    piVar3 = QAM::operator[](in_stack_fffffffffffff6e0,i);
    iVar2 = NCART(*piVar3);
    local_1c8.qam._M_elems._8_8_ = SEXT48(iVar2);
    local_1c8.qam._M_elems._0_8_ = local_190 * local_198 * local_1c8._40_8_;
    local_1d0 = local_198 * local_1c8._40_8_;
    builtin_strncpy(local_1d4,"dcba",4);
    if ((local_11 & 1) != 0) {
      std::swap<char>(local_1d4 + 3,local_1d4 + 2);
    }
    if ((local_12 & 1) != 0) {
      std::swap<char>(local_1d4 + 1,local_1d4);
    }
    this_00 = "+";
    pQVar6 = &local_1c8;
    StringBuilder<char[7],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2]>
              ((char (*) [7])in_stack_fffffffffffff7c8,(unsigned_long *)in_stack_fffffffffffff7c0,
               in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8,
               in_stack_fffffffffffff810,in_stack_fffffffffffff818,in_stack_fffffffffffff820,
               in_stack_fffffffffffff828,in_stack_fffffffffffff830,in_stack_fffffffffffff838,
               in_stack_fffffffffffff840,in_stack_fffffffffffff848,in_stack_fffffffffffff850,
               in_stack_fffffffffffff858,in_stack_fffffffffffff860,in_stack_fffffffffffff868);
    poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
    poVar5 = std::operator<<(poVar5,"double buffer[12*");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_158);
    std::operator<<(poVar5,"] SIMINT_ALIGN_ARRAY_DBL;\n\n");
    poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
    std::operator<<(poVar5,"for(int q = 0; q < ret; q++)\n");
    poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
    std::operator<<(poVar5,"{\n");
    poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent2_abi_cxx11_);
    std::operator<<(poVar5,"int idx = 0;\n");
    poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent2_abi_cxx11_);
    poVar5 = std::operator<<(poVar5,"for(int a = 0; a < ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1c8._32_8_);
    std::operator<<(poVar5,"; ++a)\n");
    poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent2_abi_cxx11_);
    poVar5 = std::operator<<(poVar5,"for(int b = 0; b < ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1c8._24_8_);
    std::operator<<(poVar5,"; ++b)\n");
    poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent2_abi_cxx11_);
    poVar5 = std::operator<<(poVar5,"for(int c = 0; c < ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1c8._16_8_);
    std::operator<<(poVar5,"; ++c)\n");
    poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent2_abi_cxx11_);
    poVar5 = std::operator<<(poVar5,"for(int d = 0; d < ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1c8.qam._M_elems._8_8_);
    std::operator<<(poVar5,"; ++d)\n");
    poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent2_abi_cxx11_);
    std::operator<<(poVar5,"{\n");
    if ((local_11 & 1) == 0) {
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent3_abi_cxx11_);
      poVar5 = std::operator<<(poVar5,"memcpy(buffer + idx + 0, ");
      paVar7 = &local_2c9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2c8,"",paVar7);
      ArrVarName(in_stack_fffffffffffff7c8,(string *)in_stack_fffffffffffff7c0);
      poVar5 = std::operator<<(poVar5,local_2a8);
      poVar5 = std::operator<<(poVar5," + ");
      poVar5 = std::operator<<(poVar5,local_1f8);
      std::operator<<(poVar5," + 0, 6*sizeof(double));\n");
      std::__cxx11::string::~string(local_2a8);
      std::__cxx11::string::~string(local_2c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
    }
    else {
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent3_abi_cxx11_);
      poVar5 = std::operator<<(poVar5,"memcpy(buffer + idx + 0, ");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_238,"",&local_239);
      ArrVarName(in_stack_fffffffffffff7c8,(string *)in_stack_fffffffffffff7c0);
      poVar5 = std::operator<<(poVar5,local_218);
      poVar5 = std::operator<<(poVar5," + ");
      poVar5 = std::operator<<(poVar5,local_1f8);
      std::operator<<(poVar5," + 3, 3*sizeof(double));\n");
      std::__cxx11::string::~string(local_218);
      std::__cxx11::string::~string(local_238);
      std::allocator<char>::~allocator((allocator<char> *)&local_239);
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent3_abi_cxx11_);
      poVar5 = std::operator<<(poVar5,"memcpy(buffer + idx + 3, ");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_280,"",&local_281);
      ArrVarName(in_stack_fffffffffffff7c8,(string *)in_stack_fffffffffffff7c0);
      poVar5 = std::operator<<(poVar5,local_260);
      poVar5 = std::operator<<(poVar5," + ");
      poVar5 = std::operator<<(poVar5,local_1f8);
      std::operator<<(poVar5," + 0, 3*sizeof(double));\n");
      std::__cxx11::string::~string(local_260);
      std::__cxx11::string::~string(local_280);
      std::allocator<char>::~allocator((allocator<char> *)&local_281);
    }
    if ((local_12 & 1) == 0) {
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent3_abi_cxx11_);
      in_stack_fffffffffffff7c8 = (QAM *)std::operator<<(poVar5,"memcpy(buffer + idx + 6, ");
      in_stack_fffffffffffff7c0 = &local_3a1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3a0,"",in_stack_fffffffffffff7c0);
      ArrVarName(in_stack_fffffffffffff7c8,(string *)in_stack_fffffffffffff7c0);
      poVar5 = std::operator<<((ostream *)in_stack_fffffffffffff7c8,local_380);
      poVar5 = std::operator<<(poVar5," + ");
      poVar5 = std::operator<<(poVar5,local_1f8);
      std::operator<<(poVar5," + 6, 6*sizeof(double));\n");
      std::__cxx11::string::~string(local_380);
      std::__cxx11::string::~string(local_3a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
    }
    else {
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent3_abi_cxx11_);
      poVar5 = std::operator<<(poVar5,"memcpy(buffer + idx + 6, ");
      paVar7 = &local_311;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_310,"",paVar7);
      ArrVarName(in_stack_fffffffffffff7c8,(string *)in_stack_fffffffffffff7c0);
      poVar5 = std::operator<<(poVar5,local_2f0);
      poVar5 = std::operator<<(poVar5," + ");
      poVar5 = std::operator<<(poVar5,local_1f8);
      std::operator<<(poVar5," + 9, 3*sizeof(double));\n");
      std::__cxx11::string::~string(local_2f0);
      std::__cxx11::string::~string(local_310);
      std::allocator<char>::~allocator((allocator<char> *)&local_311);
      poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent3_abi_cxx11_);
      poVar5 = std::operator<<(poVar5,"memcpy(buffer + idx + 9, ");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_358,"",&local_359);
      ArrVarName(in_stack_fffffffffffff7c8,(string *)in_stack_fffffffffffff7c0);
      poVar5 = std::operator<<(poVar5,local_338);
      poVar5 = std::operator<<(poVar5," + ");
      poVar5 = std::operator<<(poVar5,local_1f8);
      std::operator<<(poVar5," + 6, 3*sizeof(double));\n");
      std::__cxx11::string::~string(local_338);
      std::__cxx11::string::~string(local_358);
      std::allocator<char>::~allocator((allocator<char> *)&local_359);
    }
    poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent3_abi_cxx11_);
    std::operator<<(poVar5,"idx += 12;\n");
    poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent2_abi_cxx11_);
    std::operator<<(poVar5,"}\n");
    std::operator<<(*(ostream **)(in_RDI + 8),"\n");
    poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent2_abi_cxx11_);
    poVar5 = std::operator<<(poVar5,"memcpy(");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3e8,"",&local_3e9);
    ArrVarName(in_stack_fffffffffffff7c8,(string *)in_stack_fffffffffffff7c0);
    poVar5 = std::operator<<(poVar5,local_3c8);
    poVar5 = std::operator<<(poVar5,"+q*12*");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_158);
    poVar5 = std::operator<<(poVar5,", buffer, 12*");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_158);
    std::operator<<(poVar5,"*sizeof(double));\n");
    std::__cxx11::string::~string(local_3c8);
    std::__cxx11::string::~string(local_3e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
    poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
    std::operator<<(poVar5,"}\n");
    std::operator<<(*(ostream **)(in_RDI + 8),"\n");
    poVar5 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
    std::operator<<(poVar5,"return ret;\n");
    std::operator<<(*(ostream **)(in_RDI + 8),"}\n");
    std::operator<<(*(ostream **)(in_RDI + 8),"\n");
    poVar5 = *(ostream **)(in_RDI + 0x10);
    QAM::QAM((QAM *)this_00,pQVar6);
    FunctionPrototype__abi_cxx11_
              ((OSTEIDeriv1_Writer *)CONCAT44(iVar1,in_stack_fffffffffffff9b8),am_00);
    poVar5 = std::operator<<(poVar5,local_410);
    std::operator<<(poVar5,";\n\n");
    std::__cxx11::string::~string(local_410);
    QAM::~QAM((QAM *)0x164583);
    std::__cxx11::string::~string(local_1f8);
    std::__cxx11::string::~string(local_d8);
    local_58 = 0;
  }
  else {
    piVar3 = QAM::operator[](in_stack_fffffffffffff6e0,
                             (int)((ulong)in_stack_fffffffffffff6d8 >> 0x20));
    iVar1 = *piVar3;
    piVar3 = QAM::operator[](in_stack_fffffffffffff6e0,
                             (int)((ulong)in_stack_fffffffffffff6d8 >> 0x20));
    if (iVar1 != *piVar3) {
      piVar3 = QAM::operator[](in_stack_fffffffffffff6e0,
                               (int)((ulong)in_stack_fffffffffffff6d8 >> 0x20));
      iVar1 = *piVar3;
      piVar3 = QAM::operator[](in_stack_fffffffffffff6e0,
                               (int)((ulong)in_stack_fffffffffffff6d8 >> 0x20));
      if (iVar1 != *piVar3) goto LAB_00162757;
    }
    local_58 = 1;
  }
LAB_001645a8:
  QAM::~QAM((QAM *)0x1645b5);
  return;
}

Assistant:

void OSTEIDeriv1_Writer::Write_Permute_(QAM am, bool swap12, bool swap34) const
{
    QAM permuted = am;
    if(swap12)
        std::swap(permuted[0], permuted[1]);
    if(swap34)
        std::swap(permuted[2], permuted[3]);

    // is this permutation unique?
    if(swap34 && !swap12 && permuted[2] == permuted[3])
        return;
    if(swap12 && !swap34 && permuted[0] == permuted[1])
        return;
    if(swap12 && swap34 && (permuted[0] == permuted[1] || permuted[2] == permuted[3]))
        return;

    // output of the function starts here
    os_ << FunctionPrototype_(permuted) << "\n";
    os_ << "{\n";

    const char * P_var = "P";
    const char * Q_var = "Q";

    if(swap12)
    {
        P_var = "P_tmp";
        os_ << indent1 << "double P_AB[3*P.nshell12];\n";
    	os_ << indent1 << "struct simint_multi_shellpair P_tmp = P;\n";
        os_ << indent1 << "P_tmp.alpha2 = P.beta2;  P_tmp.beta2 = P.alpha2;\n";
        os_ << indent1 << "P_tmp.PA_x = P.PB_x;  P_tmp.PA_y = P.PB_y;  P_tmp.PA_z = P.PB_z;\n";
        os_ << indent1 << "P_tmp.PB_x = P.PA_x;  P_tmp.PB_y = P.PA_y;  P_tmp.PB_z = P.PA_z;\n";
        os_ << indent1 << "P_tmp.AB_x = P_AB;\n";
        os_ << indent1 << "P_tmp.AB_y = P_AB + P.nshell12;\n";
        os_ << indent1 << "P_tmp.AB_z = P_AB + 2*P.nshell12;\n";
        os_ << "\n";
        os_ << indent1 << "for(int i = 0; i < P.nshell12; i++)\n";
        os_ << indent1 << "{\n";
        os_ << indent2 << "P_tmp.AB_x[i] = -P.AB_x[i];\n";
        os_ << indent2 << "P_tmp.AB_y[i] = -P.AB_y[i];\n";
        os_ << indent2 << "P_tmp.AB_z[i] = -P.AB_z[i];\n";
        os_ << indent1 << "}\n\n";
    }

    if(swap34)
    {
	    Q_var = "Q_tmp";
        os_ << indent1 << "double Q_AB[3*Q.nshell12];\n";
    	os_ << indent1 << "struct simint_multi_shellpair Q_tmp = Q;\n";
        os_ << indent1 << "Q_tmp.alpha2 = Q.beta2;  Q_tmp.beta2 = Q.alpha2;\n";
		os_ << indent1 << "Q_tmp.PA_x = Q.PB_x;  Q_tmp.PA_y = Q.PB_y;  Q_tmp.PA_z = Q.PB_z;\n";
        os_ << indent1 << "Q_tmp.PB_x = Q.PA_x;  Q_tmp.PB_y = Q.PA_y;  Q_tmp.PB_z = Q.PA_z;\n";
        os_ << indent1 << "Q_tmp.AB_x = Q_AB;\n";
        os_ << indent1 << "Q_tmp.AB_y = Q_AB + Q.nshell12;\n";
        os_ << indent1 << "Q_tmp.AB_z = Q_AB + 2*Q.nshell12;\n";
        os_ << "\n";
        os_ << indent1 << "for(int i = 0; i < Q.nshell12; i++)\n";
        os_ << indent1 << "{\n";
        os_ << indent2 << "Q_tmp.AB_x[i] = -Q.AB_x[i];\n";
        os_ << indent2 << "Q_tmp.AB_y[i] = -Q.AB_y[i];\n";
        os_ << indent2 << "Q_tmp.AB_z[i] = -Q.AB_z[i];\n";
        os_ << indent1 << "}\n\n";
    }

    std::string fname = FunctionName_(am);
    os_ << indent1 << "int ret = " << fname
        << "(" << P_var << ", " << Q_var << ", screen_tol, "
        << "work, " << ArrVarName(permuted) << ");\n";


    size_t ncart_abcd = NCART(am);
    //size_t ncart_a  = NCART(am[0]);
    size_t ncart_b  = NCART(am[1]);
    size_t ncart_c  = NCART(am[2]);
    size_t ncart_d  = NCART(am[3]);
    size_t ncart_a2 = NCART(permuted[0]);
    size_t ncart_b2 = NCART(permuted[1]);
    size_t ncart_c2 = NCART(permuted[2]);
    size_t ncart_d2 = NCART(permuted[3]);

    size_t ncart_bcd = ncart_b * ncart_c * ncart_d;
    size_t ncart_cd = ncart_c * ncart_d;

    char va = 'a';
    char vb = 'b';
    char vc = 'c';
    char vd = 'd';

    if(swap12)
        std::swap(va, vb);
    if(swap34)
        std::swap(vc, vd);

    std::string idx = StringBuilder("12*(q*", ncart_abcd,
                                    "+", va, "*", ncart_bcd,
                                    "+", vb, "*", ncart_cd,
                                    "+", vc, "*", ncart_d, "+", vd, ")");

    os_ << indent1 << "double buffer[12*" << ncart_abcd << "] SIMINT_ALIGN_ARRAY_DBL;\n\n";


    os_ << indent1 << "for(int q = 0; q < ret; q++)\n";
    os_ << indent1 << "{\n";
    os_ << indent2 << "int idx = 0;\n";
    os_ << indent2 << "for(int a = 0; a < " << ncart_a2 << "; ++a)\n";
    os_ << indent2 << "for(int b = 0; b < " << ncart_b2 << "; ++b)\n";
    os_ << indent2 << "for(int c = 0; c < " << ncart_c2 << "; ++c)\n";
    os_ << indent2 << "for(int d = 0; d < " << ncart_d2 << "; ++d)\n";
    os_ << indent2 << "{\n";
    if(swap12)
    {
        os_ << indent3 << "memcpy(buffer + idx + 0, " << ArrVarName(permuted) << " + " << idx << " + 3, 3*sizeof(double));\n";
        os_ << indent3 << "memcpy(buffer + idx + 3, " << ArrVarName(permuted) << " + " << idx << " + 0, 3*sizeof(double));\n";
    }
    else
        os_ << indent3 << "memcpy(buffer + idx + 0, " << ArrVarName(permuted) << " + " << idx << " + 0, 6*sizeof(double));\n";

    if(swap34)
    {
        os_ << indent3 << "memcpy(buffer + idx + 6, " << ArrVarName(permuted) << " + " << idx << " + 9, 3*sizeof(double));\n";
        os_ << indent3 << "memcpy(buffer + idx + 9, " << ArrVarName(permuted) << " + " << idx << " + 6, 3*sizeof(double));\n";
    }
    else
        os_ << indent3 << "memcpy(buffer + idx + 6, " << ArrVarName(permuted) << " + " << idx << " + 6, 6*sizeof(double));\n";

    os_ << indent3 << "idx += 12;\n";
    os_ << indent2 << "}\n";
    os_ << "\n";
        os_ << indent2 << "memcpy(" << ArrVarName(permuted) << "+q*12*" << ncart_abcd
                       << ", buffer, 12*" << ncart_abcd << "*sizeof(double));\n";
    os_ << indent1 << "}\n";

    os_ << "\n";
    os_ << indent1 << "return ret;\n";
    os_ << "}\n";
    os_ << "\n";

    osh_ << FunctionPrototype_(permuted) << ";\n\n";
}